

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

bool __thiscall
ImplicitDepLoader::LoadDepFile(ImplicitDepLoader *this,Edge *edge,string *path,string *err)

{
  size_t *len;
  Node *pNVar1;
  size_t __n;
  pointer pcVar2;
  Metrics *this_00;
  bool bVar3;
  int iVar4;
  long *plVar5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var6;
  undefined8 *puVar7;
  Metric *pMVar8;
  ulong *puVar9;
  undefined1 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  StringPiece *pSVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string depfile_err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string content;
  DepfileParser depfile;
  ScopedMetric metrics_h_scoped;
  uint64_t unused;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  undefined8 local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  string local_120;
  undefined1 *local_100;
  long local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  long local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  string local_c0;
  undefined1 local_a0 [24];
  pointer apSStack_88 [2];
  pointer local_78;
  string local_68;
  ScopedMetric local_48;
  uint64_t local_38;
  
  if ((LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric ==
       '\0') &&
     (iVar4 = __cxa_guard_acquire(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar8 = (Metric *)0x0;
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"depfile load","");
      pMVar8 = Metrics::NewMetric(this_00,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    LoadDepFile::metrics_h_metric = pMVar8;
    __cxa_guard_release(&LoadDepFile(Edge*,std::__cxx11::string_const&,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_48,LoadDepFile::metrics_h_metric);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  iVar4 = (**(code **)(*(long *)this->disk_interface_ + 0x10))
                    (this->disk_interface_,path,&local_c0,err);
  if (iVar4 == 1) {
    err->_M_string_length = 0;
    *(err->_M_dataplus)._M_p = '\0';
LAB_00116693:
    if (local_c0._M_string_length != 0) {
      DepfileParser::DepfileParser((DepfileParser *)local_a0);
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_120._M_string_length = 0;
      local_120.field_2._M_allocated_capacity =
           local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar3 = DepfileParser::Parse((DepfileParser *)local_a0,&local_c0,&local_120);
      uVar11 = local_a0._0_8_;
      if (bVar3) {
        if (local_a0._0_8_ == local_a0._8_8_) {
          pcVar2 = (path->_M_dataplus)._M_p;
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,pcVar2,pcVar2 + path->_M_string_length);
          std::__cxx11::string::append((char *)&local_160);
          std::__cxx11::string::operator=((string *)err,(string *)&local_160);
          local_d0._M_allocated_capacity = local_160.field_2._M_allocated_capacity;
          _Var13._M_p = local_160._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) goto LAB_0011697d;
          goto LAB_00116985;
        }
        len = (size_t *)(local_a0._0_8_ + 8);
        CanonicalizePath(*(char **)local_a0._0_8_,len,&local_38);
        pNVar1 = *(edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __n = (pNVar1->path_)._M_string_length;
        if ((__n == *len) &&
           (iVar4 = bcmp((pNVar1->path_)._M_dataplus._M_p,*(char **)uVar11,__n), iVar4 == 0)) {
          pSVar14 = (StringPiece *)local_a0._0_8_;
          if (local_a0._0_8_ != local_a0._8_8_) {
            do {
              _Var6 = std::
                      __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_pred<matches>>
                                ((edge->outputs_).
                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                 super__Vector_impl_data._M_start,
                                 (edge->outputs_).
                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish,pSVar14);
              if (_Var6._M_current ==
                  (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pcVar2 = (path->_M_dataplus)._M_p;
                local_e0 = &local_d0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_e0,pcVar2,pcVar2 + path->_M_string_length);
                std::__cxx11::string::append((char *)&local_e0);
                local_100 = &local_f0;
                if (pSVar14->len_ == 0) {
                  local_f8 = 0;
                  local_f0 = 0;
                }
                else {
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_100,pSVar14->str_,pSVar14->str_ + pSVar14->len_);
                }
                uVar11 = 0xf;
                if (local_e0 != &local_d0) {
                  uVar11 = local_d0._M_allocated_capacity;
                }
                if ((ulong)uVar11 < (ulong)(local_f8 + local_d8)) {
                  uVar12 = 0xf;
                  if (local_100 != &local_f0) {
                    uVar12 = CONCAT71(uStack_ef,local_f0);
                  }
                  if (uVar12 < (ulong)(local_f8 + local_d8)) goto LAB_00116b5b;
                  puVar7 = (undefined8 *)
                           std::__cxx11::string::replace
                                     ((ulong)&local_100,0,(char *)0x0,(ulong)local_e0);
                }
                else {
LAB_00116b5b:
                  puVar7 = (undefined8 *)
                           std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_100);
                }
                local_140 = &local_130;
                puVar9 = puVar7 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar9) {
                  local_130._M_allocated_capacity = *puVar9;
                  local_130._8_8_ = puVar7[3];
                }
                else {
                  local_130._M_allocated_capacity = *puVar9;
                  local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)*puVar7;
                }
                local_138 = puVar7[1];
                *puVar7 = puVar9;
                puVar7[1] = 0;
                *(undefined1 *)puVar9 = 0;
                puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
                puVar9 = puVar7 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar9) {
                  local_160.field_2._M_allocated_capacity = *puVar9;
                  local_160.field_2._8_8_ = puVar7[3];
                  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
                }
                else {
                  local_160.field_2._M_allocated_capacity = *puVar9;
                  local_160._M_dataplus._M_p = (pointer)*puVar7;
                }
                local_160._M_string_length = puVar7[1];
                *puVar7 = puVar9;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                std::__cxx11::string::operator=((string *)err,(string *)&local_160);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_160._M_dataplus._M_p != &local_160.field_2) {
                  operator_delete(local_160._M_dataplus._M_p,
                                  local_160.field_2._M_allocated_capacity + 1);
                }
                if (local_140 != &local_130) {
                  operator_delete(local_140,local_130._M_allocated_capacity + 1);
                }
                if (local_100 != &local_f0) {
                  operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
                }
                _Var13._M_p = (pointer)local_e0;
                if (local_e0 != &local_d0) goto LAB_0011697d;
                goto LAB_00116985;
              }
              pSVar14 = pSVar14 + 1;
            } while (pSVar14 != (StringPiece *)local_a0._8_8_);
          }
          iVar4 = (**this->_vptr_ImplicitDepLoader)(this,edge,apSStack_88,err);
          uVar10 = (undefined1)iVar4;
        }
        else {
          if (g_explaining == true) {
            StringPiece::AsString_abi_cxx11_(&local_160,(StringPiece *)uVar11);
            LoadDepFile();
          }
          uVar10 = 0;
        }
      }
      else {
        pcVar2 = (path->_M_dataplus)._M_p;
        local_140 = &local_130;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,pcVar2,pcVar2 + path->_M_string_length);
        std::__cxx11::string::append((char *)&local_140);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_140,(ulong)local_120._M_dataplus._M_p);
        puVar9 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar9) {
          local_160.field_2._M_allocated_capacity = *puVar9;
          local_160.field_2._8_8_ = puVar7[3];
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        }
        else {
          local_160.field_2._M_allocated_capacity = *puVar9;
          local_160._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_160._M_string_length = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)err,(string *)&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        local_d0._M_allocated_capacity = local_130._M_allocated_capacity;
        _Var13._M_p = (pointer)local_140;
        if (local_140 != &local_130) {
LAB_0011697d:
          operator_delete(_Var13._M_p,local_d0._M_allocated_capacity + 1);
        }
LAB_00116985:
        uVar10 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if (apSStack_88[0] != (pointer)0x0) {
        operator_delete(apSStack_88[0],(long)local_78 - (long)apSStack_88[0]);
      }
      if ((StringPiece *)local_a0._0_8_ != (StringPiece *)0x0) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ - local_a0._0_8_);
      }
      goto LAB_001169d8;
    }
    if (g_explaining == true) {
      LoadDepFile((ImplicitDepLoader *)path);
    }
  }
  else {
    if (iVar4 != 2) goto LAB_00116693;
    std::operator+(&local_160,"loading \'",path);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_160);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_120.field_2._M_allocated_capacity = *puVar9;
      local_120.field_2._8_8_ = plVar5[3];
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *puVar9;
      local_120._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_120._M_string_length = plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_120,(ulong)(err->_M_dataplus)._M_p);
    pSVar14 = (StringPiece *)(plVar5 + 2);
    if ((StringPiece *)*plVar5 == pSVar14) {
      local_a0._16_8_ = pSVar14->str_;
      apSStack_88[0] = (pointer)plVar5[3];
      local_a0._0_8_ = (StringPiece *)(local_a0 + 0x10);
    }
    else {
      local_a0._16_8_ = pSVar14->str_;
      local_a0._0_8_ = (StringPiece *)*plVar5;
    }
    local_a0._8_8_ = plVar5[1];
    *plVar5 = (long)pSVar14;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)local_a0);
    if ((StringPiece *)local_a0._0_8_ != (StringPiece *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_,(ulong)((long)(char **)local_a0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  uVar10 = 0;
LAB_001169d8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  ScopedMetric::~ScopedMetric(&local_48);
  return (bool)uVar10;
}

Assistant:

bool ImplicitDepLoader::LoadDepFile(Edge* edge, const string& path,
                                    string* err) {
  METRIC_RECORD("depfile load");
  // Read depfile content.  Treat a missing depfile as empty.
  string content;
  switch (disk_interface_->ReadFile(path, &content, err)) {
  case DiskInterface::Okay:
    break;
  case DiskInterface::NotFound:
    err->clear();
    break;
  case DiskInterface::OtherError:
    *err = "loading '" + path + "': " + *err;
    return false;
  }
  // On a missing depfile: return false and empty *err.
  if (content.empty()) {
    EXPLAIN("depfile '%s' is missing", path.c_str());
    return false;
  }

  DepfileParser depfile(depfile_parser_options_
                        ? *depfile_parser_options_
                        : DepfileParserOptions());
  string depfile_err;
  if (!depfile.Parse(&content, &depfile_err)) {
    *err = path + ": " + depfile_err;
    return false;
  }

  if (depfile.outs_.empty()) {
    *err = path + ": no outputs declared";
    return false;
  }

  uint64_t unused;
  std::vector<StringPiece>::iterator primary_out = depfile.outs_.begin();
  CanonicalizePath(const_cast<char*>(primary_out->str_), &primary_out->len_,
                   &unused);

  // Check that this depfile matches the edge's output, if not return false to
  // mark the edge as dirty.
  Node* first_output = edge->outputs_[0];
  StringPiece opath = StringPiece(first_output->path());
  if (opath != *primary_out) {
    EXPLAIN("expected depfile '%s' to mention '%s', got '%s'", path.c_str(),
            first_output->path().c_str(), primary_out->AsString().c_str());
    return false;
  }

  // Ensure that all mentioned outputs are outputs of the edge.
  for (std::vector<StringPiece>::iterator o = depfile.outs_.begin();
       o != depfile.outs_.end(); ++o) {
    matches m(o);
    if (std::find_if(edge->outputs_.begin(), edge->outputs_.end(), m) == edge->outputs_.end()) {
      *err = path + ": depfile mentions '" + o->AsString() + "' as an output, but no such output was declared";
      return false;
    }
  }

  return ProcessDepfileDeps(edge, &depfile.ins_, err);
}